

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O2

ResamplerFunc PrepareResampler(Resampler resampler,ALuint increment,InterpState *state)

{
  BSincTable *table;
  ResamplerFunc p_Var1;
  code *pcVar2;
  
  switch(resampler) {
  case Linear:
    if ((CPUCapFlags & 8U) == 0) {
      if ((CPUCapFlags & 2U) == 0) {
        pcVar2 = Resample_<LerpTag,CTag>;
      }
      else {
        pcVar2 = Resample_<LerpTag,SSE2Tag>;
      }
    }
    else {
      pcVar2 = Resample_<LerpTag,SSE4Tag>;
    }
    break;
  case Cubic:
    pcVar2 = Resample_<CubicTag,CTag>;
    break;
  case FastBSinc12:
  case BSinc12:
    table = &bsinc12;
    goto LAB_0013259e;
  case FastBSinc24:
  case BSinc24:
    table = &bsinc24;
LAB_0013259e:
    anon_unknown.dwarf_cf178::BsincPrepare(increment,&state->bsinc,table);
    p_Var1 = (ResamplerFunc)
             (*(code *)(&DAT_001702c8 +
                       *(int *)(&DAT_001702c8 + (ulong)(resampler - FastBSinc12) * 4)))();
    return p_Var1;
  default:
    pcVar2 = Resample_<PointTag,CTag>;
  }
  return pcVar2;
}

Assistant:

ResamplerFunc PrepareResampler(Resampler resampler, ALuint increment, InterpState *state)
{
    switch(resampler)
    {
    case Resampler::Point:
    case Resampler::Linear:
    case Resampler::Cubic:
        break;
    case Resampler::FastBSinc12:
    case Resampler::BSinc12:
        BsincPrepare(increment, &state->bsinc, &bsinc12);
        break;
    case Resampler::FastBSinc24:
    case Resampler::BSinc24:
        BsincPrepare(increment, &state->bsinc, &bsinc24);
        break;
    }
    return SelectResampler(resampler, increment);
}